

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
despot::Parser::ComputeState
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Parser *this,double random)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  int local_38;
  int s;
  allocator<int> local_22;
  undefined1 local_21;
  double local_20;
  double random_local;
  Parser *this_local;
  vector<int,_std::allocator<int>_> *state;
  
  local_21 = 0;
  local_20 = random;
  random_local = (double)this;
  this_local = (Parser *)__return_storage_ptr__;
  sVar2 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                    (&this->curr_state_vars_);
  std::allocator<int>::allocator(&local_22);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,sVar2,&local_22);
  std::allocator<int>::~allocator(&local_22);
  for (local_38 = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__),
      (ulong)(long)local_38 < sVar2; local_38 = local_38 + 1) {
    pvVar3 = std::vector<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>::operator[]
                       (&this->initial_belief_funcs_,(long)local_38);
    iVar1 = (*(pvVar3->super_CPT).super_Function._vptr_Function[0xe])(pvVar3,&local_20);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_38);
    *pvVar4 = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Parser::ComputeState(double random) const {
	vector<int> state(curr_state_vars_.size());
	for (int s = 0; s < state.size(); s++) {
		state[s] = initial_belief_funcs_[s].ComputeCurrentIndex(random);
	}

	return state;
}